

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle2.cpp
# Opt level: O2

void __thiscall OpenMD::GofRAngle2::preProcess(GofRAngle2 *this)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  pointer pvVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  long lVar10;
  
  pvVar1 = (this->avgGofr_).
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->avgGofr_).
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar7 = 0; uVar8 = (ulong)uVar7, uVar8 < (ulong)(((long)pvVar2 - (long)pvVar1) / 0x18);
      uVar7 = uVar7 + 1) {
    lVar3 = *(long *)&pvVar1[uVar8].
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data;
    pvVar4 = *(pointer *)
              ((long)&pvVar1[uVar8].
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    for (uVar6 = 0; (ulong)uVar6 < (ulong)(((long)pvVar4 - lVar3) / 0x18); uVar6 = uVar6 + 1) {
      lVar10 = (ulong)uVar6 * 0x18;
      puVar5 = *(undefined8 **)(lVar3 + 8 + lVar10);
      for (puVar9 = *(undefined8 **)(lVar3 + lVar10); puVar9 != puVar5; puVar9 = puVar9 + 1) {
        *puVar9 = 0;
      }
    }
  }
  return;
}

Assistant:

void GofRAngle2::preProcess() {
    for (unsigned int i = 0; i < avgGofr_.size(); ++i) {
      for (unsigned int j = 0; j < avgGofr_[i].size(); ++j) {
        std::fill(avgGofr_[i][j].begin(), avgGofr_[i][j].end(), 0.0);
      }
    }
  }